

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O1

void __thiscall string_view_at_Test::TestBody(string_view_at_Test *this)

{
  bool bVar1;
  int line;
  char *pcVar2;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  
  local_38.ptr_._0_1_ = 0x77;
  testing::internal::CmpHelperEQ<char,char>(local_30,"\'w\'","sv.at(0)",(char *)&local_38,"words");
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    line = 0xa0;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_38.ptr_._0_1_ = 0x6f;
    testing::internal::CmpHelperEQ<char,char>(local_30,"\'o\'","sv.at(1)",(char *)&local_38,"ords");
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      line = 0xa1;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_38.ptr_._0_1_ = 0x72;
      testing::internal::CmpHelperEQ<char,char>(local_30,"\'r\'","sv.at(2)",(char *)&local_38,"rds")
      ;
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xa2;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_38.ptr_._0_1_ = 100;
        testing::internal::CmpHelperEQ<char,char>
                  (local_30,"\'d\'","sv.at(3)",(char *)&local_38,"ds");
        if (local_30[0] != (internal)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_38.ptr_._0_1_ = 0x73;
          testing::internal::CmpHelperEQ<char,char>
                    (local_30,"\'s\'","sv.at(4)",(char *)&local_38,"s");
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_38);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                       ,0xa4,pcVar2);
            testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_20);
            if (local_38.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_38.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_38.ptr_ + 8))();
              }
              local_38.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          goto LAB_001f5f2e;
        }
        testing::Message::Message((Message *)&local_38);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xa3;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  if (local_38.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
    }
    local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
LAB_001f5f2e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, at) {
  string_view sv("words");
  ASSERT_EQ('w', sv.at(0));
  ASSERT_EQ('o', sv.at(1));
  ASSERT_EQ('r', sv.at(2));
  ASSERT_EQ('d', sv.at(3));
  ASSERT_EQ('s', sv.at(4));
}